

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSpace::IfcSpace(IfcSpace *this)

{
  IfcSpace *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x198,"IfcSpace");
  IfcSpatialStructureElement::IfcSpatialStructureElement
            (&this->super_IfcSpatialStructureElement,&PTR_construction_vtable_24__00ff0bb8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpace,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpace,_2UL> *)
             &(this->super_IfcSpatialStructureElement).field_0x158,
             &PTR_construction_vtable_24__00ff0ca8);
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0xff0ab0;
  *(undefined8 *)&this->field_0x198 = 0xff0ba0;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x88 = 0xff0ad8;
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xff0b00;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0xff0b28;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.field_0x100 = 0xff0b50;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x158 = 0xff0b78;
  std::__cxx11::string::string((string *)&(this->super_IfcSpatialStructureElement).field_0x168);
  STEP::Maybe<double>::Maybe(&this->ElevationWithFlooring);
  return;
}

Assistant:

IfcSpace() : Object("IfcSpace") {}